

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
::reset(list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
        *this)

{
  rmutex *in_RDI;
  auto_mutex M;
  auto_mutex *in_stack_ffffffffffffffd0;
  
  auto_mutex::auto_mutex(in_stack_ffffffffffffffd0,in_RDI);
  array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  ::reset((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
           *)&in_RDI[0x27].m.myMutex.__data.__list);
  auto_mutex::~auto_mutex((auto_mutex *)0x45210c);
  return;
}

Assistant:

void list_box<S>::
    reset (
    ) const
    {
        auto_mutex M(m);
        items.reset();
    }